

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

size_t TtfUtil::LocaGlyphCount(size_t lLocaSize,void *pHead)

{
  int16 iVar1;
  ulong uVar2;
  domain_error *this;
  ulong in_RDI;
  FontHeader *pTable;
  size_t local_8;
  
  iVar1 = read<short>(0);
  if (iVar1 == 0) {
    uVar2 = in_RDI >> 1;
  }
  else {
    iVar1 = read<short>(0);
    if (iVar1 != 1) {
      this = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this,"head table in inconsistent state. The font may be corrupted");
      __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    uVar2 = in_RDI >> 2;
  }
  local_8 = uVar2 - 1;
  return local_8;
}

Assistant:

size_t LocaGlyphCount(size_t lLocaSize, const void * pHead)
{

	const Sfnt::FontHeader * pTable 
		= reinterpret_cast<const Sfnt::FontHeader *>(pHead);

	if (read(pTable->index_to_loc_format) 
		== Sfnt::FontHeader::ShortIndexLocFormat)
	// loca entries are two bytes and have been divided by two
		return (lLocaSize >> 1) - 1;
	
	if (read(pTable->index_to_loc_format) 
		== Sfnt::FontHeader::LongIndexLocFormat)
	 // loca entries are four bytes
		return (lLocaSize >> 2) - 1;

	//return -1;
	throw std::domain_error("head table in inconsistent state. The font may be corrupted");
}